

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.h
# Opt level: O1

void __thiscall FIX::Session::reset(Session *this)

{
  long *local_38 [2];
  long local_28 [2];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"");
  FIX::Session::generateLogout((string *)this);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  FIX::Session::disconnect();
  SessionState::reset((SessionState *)(this + 0x250));
  return;
}

Assistant:

void reset() EXCEPT ( IOException )
  { generateLogout(); disconnect(); m_state.reset(); }